

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void TestDacRW(BasePort *port,uchar boardNum)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  ulong uVar26;
  int iVar27;
  byte bVar29;
  ostream *poVar28;
  long lVar30;
  uint *puVar31;
  long lVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  quadlet_t write_block [6];
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  if (boardNum < 0x10) {
    local_48 = port->FirmwareVersion[boardNum];
  }
  else {
    local_48 = 0;
  }
  local_38 = (ulong)(7 < local_48);
  puVar31 = &local_68 + local_38;
  lVar32 = 1;
  lVar30 = 0x11;
  do {
    *puVar31 = 0;
    uStack_70 = 0x107a4b;
    iVar27 = (*port->_vptr_BasePort[0x23])(port,(ulong)boardNum,lVar30,puVar31);
    if ((char)iVar27 == '\0') {
      uStack_70 = 0x107a6a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read quadlet for channel ",0x23);
      uStack_70 = 0x107a75;
      poVar28 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uStack_70 = 0x107a8c;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar28 + -0x18) + (char)poVar28);
      uStack_70 = 0x107a97;
      std::ostream::put((char)poVar28);
      uStack_70 = 0x107a9f;
      std::ostream::flush();
    }
    *puVar31 = (uint)(ushort)*puVar31;
    puVar31 = puVar31 + 1;
    lVar32 = lVar32 + 1;
    lVar30 = lVar30 + 0x10;
  } while (lVar32 != 5);
  local_40 = (ulong)(7 < local_48) + 5;
  uStack_70 = 0x107b04;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read from DAC: ",0xf);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  uStack_70 = 0x107b2b;
  poVar28 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_70 = 0x107b3e;
  std::__ostream_insert<char,std::char_traits<char>>(poVar28,", ",2);
  uStack_70 = 0x107b4a;
  poVar28 = std::ostream::_M_insert<unsigned_long>((ulong)poVar28);
  uStack_70 = 0x107b5d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar28,", ",2);
  uVar26 = local_38;
  uStack_70 = 0x107b6f;
  poVar28 = std::ostream::_M_insert<unsigned_long>((ulong)poVar28);
  uStack_70 = 0x107b82;
  std::__ostream_insert<char,std::char_traits<char>>(poVar28,", ",2);
  uVar33 = local_48;
  uStack_70 = 0x107b94;
  poVar28 = std::ostream::_M_insert<unsigned_long>((ulong)poVar28);
  uStack_70 = 0x107bab;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar28 + -0x18) + (char)poVar28);
  uStack_70 = 0x107bb6;
  std::ostream::put((char)poVar28);
  uStack_70 = 0x107bbe;
  std::ostream::flush();
  bVar29 = boardNum;
  if (7 < uVar33) {
    local_68 = (uint)boardNum << 0x10 | 0x6000000;
    bVar29 = 0;
  }
  auVar34._0_4_ = (&local_68)[uVar26] + 0x100;
  auVar34._4_4_ = (&local_64)[uVar26] + 0x200;
  auVar34._8_4_ = (&local_60)[uVar26] + 0x300;
  auVar34._12_4_ = (&uStack_5c)[uVar26] + 0x400;
  auVar34 = auVar34 | _DAT_00120070;
  auVar36[1] = 0;
  auVar36[0] = auVar34[8];
  auVar36[2] = auVar34[9];
  auVar36[3] = 0;
  auVar36[4] = auVar34[10];
  auVar36[5] = 0;
  auVar36[6] = auVar34[0xb];
  auVar36[7] = 0;
  auVar36[8] = auVar34[0xc];
  auVar36[9] = 0;
  auVar36[10] = auVar34[0xd];
  auVar36[0xb] = 0;
  auVar36[0xc] = auVar34[0xe];
  auVar36[0xd] = 0;
  auVar36[0xe] = auVar34[0xf];
  auVar36[0xf] = 0;
  auVar35 = pshuflw(auVar36,auVar36,0x1b);
  auVar36 = pshufhw(auVar35,auVar35,0x1b);
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar34._0_13_;
  auVar17[0xe] = auVar34[7];
  auVar18[0xc] = auVar34[6];
  auVar18._0_12_ = auVar34._0_12_;
  auVar18._13_2_ = auVar17._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar34._0_11_;
  auVar19._12_3_ = auVar18._12_3_;
  auVar20[10] = auVar34[5];
  auVar20._0_10_ = auVar34._0_10_;
  auVar20._11_4_ = auVar19._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar34._0_9_;
  auVar21._10_5_ = auVar20._10_5_;
  auVar22[8] = auVar34[4];
  auVar22._0_8_ = auVar34._0_8_;
  auVar22._9_6_ = auVar21._9_6_;
  auVar23._7_8_ = 0;
  auVar23._0_7_ = auVar22._8_7_;
  auVar24._1_8_ = SUB158(auVar23 << 0x40,7);
  auVar24[0] = auVar34[3];
  auVar24._9_6_ = 0;
  auVar25._1_10_ = SUB1510(auVar24 << 0x30,5);
  auVar25[0] = auVar34[2];
  auVar25._11_4_ = 0;
  auVar35._3_12_ = SUB1512(auVar25 << 0x20,3);
  auVar35[2] = auVar34[1];
  auVar35[0] = auVar34[0];
  auVar35[1] = 0;
  auVar35[0xf] = 0;
  auVar34 = pshuflw(auVar35,auVar35,0x1b);
  auVar34 = pshufhw(auVar34,auVar34,0x1b);
  sVar1 = auVar34._0_2_;
  sVar2 = auVar34._2_2_;
  sVar3 = auVar34._4_2_;
  sVar4 = auVar34._6_2_;
  sVar5 = auVar34._8_2_;
  sVar6 = auVar34._10_2_;
  sVar7 = auVar34._12_2_;
  sVar8 = auVar34._14_2_;
  sVar9 = auVar36._0_2_;
  sVar10 = auVar36._2_2_;
  sVar11 = auVar36._4_2_;
  sVar12 = auVar36._6_2_;
  sVar13 = auVar36._8_2_;
  sVar14 = auVar36._10_2_;
  sVar15 = auVar36._12_2_;
  sVar16 = auVar36._14_2_;
  lVar30 = uVar26 * 4;
  *(char *)(&local_68 + uVar26) = (0 < sVar1) * (sVar1 < 0x100) * auVar34[0] - (0xff < sVar1);
  *(char *)((long)&local_68 + lVar30 + 1) =
       (0 < sVar2) * (sVar2 < 0x100) * auVar34[2] - (0xff < sVar2);
  *(char *)((long)&local_68 + lVar30 + 2) =
       (0 < sVar3) * (sVar3 < 0x100) * auVar34[4] - (0xff < sVar3);
  *(byte *)((long)&local_68 + lVar30 + 3) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar34[6] - (0xff < sVar4) | bVar29;
  *(char *)(&local_64 + uVar26) = (0 < sVar5) * (sVar5 < 0x100) * auVar34[8] - (0xff < sVar5);
  *(char *)((long)&local_64 + lVar30 + 1) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar34[10] - (0xff < sVar6);
  *(char *)((long)&local_64 + lVar30 + 2) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar34[0xc] - (0xff < sVar7);
  *(byte *)((long)&local_64 + lVar30 + 3) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar34[0xe] - (0xff < sVar8) | bVar29;
  *(char *)(&local_60 + uVar26) = (0 < sVar9) * (sVar9 < 0x100) * auVar36[0] - (0xff < sVar9);
  *(char *)((long)&local_60 + lVar30 + 1) =
       (0 < sVar10) * (sVar10 < 0x100) * auVar36[2] - (0xff < sVar10);
  *(char *)((long)&local_60 + lVar30 + 2) =
       (0 < sVar11) * (sVar11 < 0x100) * auVar36[4] - (0xff < sVar11);
  *(byte *)((long)&local_60 + lVar30 + 3) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar36[6] - (0xff < sVar12) | bVar29;
  *(char *)(&uStack_5c + uVar26) = (0 < sVar13) * (sVar13 < 0x100) * auVar36[8] - (0xff < sVar13);
  *(char *)((long)&uStack_5c + lVar30 + 1) =
       (0 < sVar14) * (sVar14 < 0x100) * auVar36[10] - (0xff < sVar14);
  *(char *)((long)&uStack_5c + lVar30 + 2) =
       (0 < sVar15) * (sVar15 < 0x100) * auVar36[0xc] - (0xff < sVar15);
  *(byte *)((long)&uStack_5c + lVar30 + 3) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar36[0xe] - (0xff < sVar16) | bVar29;
  uVar33 = (ulong)(uint)((int)local_40 << 2);
  *(undefined4 *)((long)&uStack_70 + uVar33 + 4) = 0;
  uStack_70 = 0x107c62;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setting new values",0x12);
  uStack_70 = 0x107c76;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  uStack_70 = 0x107c81;
  std::ostream::put(-0x20);
  uStack_70 = 0x107c89;
  std::ostream::flush();
  uStack_70 = 0x107ca0;
  iVar27 = (*port->_vptr_BasePort[0x27])(port,(ulong)boardNum,0,&local_68,uVar33);
  if ((char)iVar27 == '\0') {
    uStack_70 = 0x107cb8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to write block data",0x1a);
    uStack_70 = 0x107ccc;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    uStack_70 = 0x107cd7;
    std::ostream::put(-0x20);
    uStack_70 = 0x107cdf;
    std::ostream::flush();
  }
  return;
}

Assistant:

void TestDacRW(BasePort *port, unsigned char boardNum)
{
    size_t i;
    quadlet_t write_block[6];

    size_t i0 = 0;
    size_t numQuads = 5;
    unsigned long fver = port->GetFirmwareVersion(boardNum);
    if (fver > 7) {
        i0 = 1;
        numQuads = 6;
    }

    // Read from DAC (quadlet reads), modify values, write them using
    // a block write.
    for (i = 0; i < 4; i++) {
        nodeaddr_t addr = 0x0001 | ((i+1) << 4);  // channel 1-4, DAC Control
        write_block[i0+i] = 0;
        if (!port->ReadQuadlet(boardNum, addr, write_block[i0+i]))
            std::cout << "Failed to read quadlet for channel " << (i+1) << std::endl;
        write_block[i0+i] &= 0x0000ffff;
    }
    std::cout << "Read from DAC: " << std::hex << write_block[i0+0] << ", "
              << write_block[i0+1] << ", " << write_block[i0+2] << ", "
              << write_block[i0+3] << std::endl;
    if (fver > 7) {
        write_block[0] = bswap_32(static_cast<quadlet_t>((boardNum << 8) | numQuads));
    }
    for (i = 0; i < 4; i++) {
        write_block[i0+i] = bswap_32(VALID_BIT | (write_block[i0+i]+static_cast<quadlet_t>(i+1)*0x100));
        if (fver < 8)
            write_block[i0+i] |= (boardNum<<24);
    }
    write_block[numQuads-1] = 0;   // power control
    std::cout << "Setting new values" << std::endl;
    if (!port->WriteBlock(boardNum, 0, write_block, numQuads*sizeof(quadlet_t)))
        std::cout << "Failed to write block data" << std::endl;
}